

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NewFrame(void)

{
  bool bVar1;
  ImGuiKeyModFlags IVar2;
  ImGuiContextHook *pIVar3;
  ImGuiViewportP **ppIVar4;
  ImGuiWindow *pIVar5;
  ImGuiWindow **ppIVar6;
  float *pfVar7;
  float x1;
  float fVar8;
  undefined1 auVar9 [64];
  undefined1 auVar11 [56];
  undefined1 auVar10 [64];
  undefined1 auVar12 [64];
  undefined1 auVar14 [56];
  undefined1 auVar13 [64];
  ImRect IVar15;
  ImVec4 IVar16;
  int i_2;
  ImGuiWindow *window;
  int i_1;
  float memory_compact_start_time;
  int i;
  ImGuiViewportP *viewport;
  int n_2;
  int n_1;
  ImRect virtual_space;
  int n;
  ImGuiContext *g;
  ImGuiWindowFlags in_stack_00000344;
  bool *in_stack_00000348;
  char *in_stack_00000350;
  undefined4 in_stack_ffffffffffffff58;
  int in_stack_ffffffffffffff5c;
  float in_stack_ffffffffffffff60;
  float fVar17;
  float in_stack_ffffffffffffff64;
  float in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  ImGuiTable *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  uint3 in_stack_ffffffffffffff7c;
  ImGuiContextHookType hook_type;
  ImVec2 in_stack_ffffffffffffff80;
  int local_74;
  int local_64;
  ImVec2 local_5c;
  int local_54;
  ImGuiViewportP *local_50;
  int local_44;
  undefined8 local_40;
  undefined8 local_38;
  ImRect local_30;
  int local_20;
  ImRect local_1c;
  int local_c;
  ImGuiContext *local_8;
  
  hook_type = (ImGuiContextHookType)in_stack_ffffffffffffff7c;
  if (GImGui != (ImGuiContext *)0x0) {
    hook_type = CONCAT13(1,in_stack_ffffffffffffff7c);
  }
  if ((char)(hook_type >> 0x18) == '\0') {
    __assert_fail("GImGui != __null && \"No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                  ,0xf01,"void ImGui::NewFrame()");
  }
  local_8 = GImGui;
  local_c = (GImGui->Hooks).Size;
  while (local_c = local_c + -1, -1 < local_c) {
    pIVar3 = ImVector<ImGuiContextHook>::operator[]
                       ((ImVector<ImGuiContextHook> *)
                        CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        in_stack_ffffffffffffff5c);
    if (*(int *)(pIVar3 + 4) == 7) {
      in_stack_ffffffffffffff70 = (ImGuiTable *)&local_8->Hooks;
      ImVector<ImGuiContextHook>::operator[]
                ((ImVector<ImGuiContextHook> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      ImVector<ImGuiContextHook>::erase
                ((ImVector<ImGuiContextHook> *)in_stack_ffffffffffffff70,
                 (ImGuiContextHook *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
    }
  }
  CallContextHooks((ImGuiContext *)in_stack_ffffffffffffff80,hook_type);
  ErrorCheckNewFrameSanityChecks();
  UpdateSettings();
  local_8->Time = (double)(local_8->IO).DeltaTime + local_8->Time;
  local_8->WithinFrameScope = true;
  local_8->FrameCount = local_8->FrameCount + 1;
  local_8->TooltipOverrideCount = 0;
  local_8->WindowsActiveCount = 0;
  ImVector<unsigned_int>::resize
            ((ImVector<unsigned_int> *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
             ,in_stack_ffffffffffffff5c);
  local_8->FramerateSecPerFrameAccum =
       ((local_8->IO).DeltaTime - local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx]) +
       local_8->FramerateSecPerFrameAccum;
  local_8->FramerateSecPerFrame[local_8->FramerateSecPerFrameIdx] = (local_8->IO).DeltaTime;
  local_8->FramerateSecPerFrameIdx = (local_8->FramerateSecPerFrameIdx + 1) % 0x78;
  if (local_8->FramerateSecPerFrameAccum <= 0.0) {
    x1 = 3.4028235e+38;
  }
  else {
    x1 = 1.0 / (local_8->FramerateSecPerFrameAccum / 120.0);
  }
  (local_8->IO).Framerate = x1;
  UpdateViewportsNewFrame();
  ((local_8->IO).Fonts)->Locked = true;
  GetDefaultFont();
  SetCurrentFont((ImFont *)in_stack_ffffffffffffff70);
  bVar1 = ImFont::IsLoaded(local_8->Font);
  if (bVar1) {
    auVar12 = ZEXT464(0x7f7fffff);
    auVar9 = ZEXT1664(auVar12._0_16_);
    ImRect::ImRect((ImRect *)in_stack_ffffffffffffff70,x1,in_stack_ffffffffffffff68,
                   in_stack_ffffffffffffff64,in_stack_ffffffffffffff60);
    local_20 = 0;
    while( true ) {
      auVar14 = auVar12._8_56_;
      auVar11 = auVar9._8_56_;
      if ((local_8->Viewports).Size <= local_20) break;
      ImVector<ImGuiViewportP_*>::operator[]
                ((ImVector<ImGuiViewportP_*> *)
                 CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                 in_stack_ffffffffffffff5c);
      IVar15 = ImGuiViewportP::GetMainRect((ImGuiViewportP *)0x1b7236);
      auVar12._0_8_ = IVar15.Max;
      auVar12._8_56_ = auVar14;
      auVar9._0_8_ = IVar15.Min;
      auVar9._8_56_ = auVar11;
      local_30.Min = (ImVec2)vmovlpd_avx(auVar9._0_16_);
      local_30.Max = (ImVec2)vmovlpd_avx(auVar12._0_16_);
      ImRect::Add(&local_1c,&local_30);
      local_20 = local_20 + 1;
    }
    IVar16 = ImRect::ToVec4((ImRect *)0x1b7277);
    auVar13._0_8_ = IVar16._8_8_;
    auVar13._8_56_ = auVar14;
    auVar10._0_8_ = IVar16._0_8_;
    auVar10._8_56_ = auVar11;
    local_40 = vmovlpd_avx(auVar10._0_16_);
    local_38 = vmovlpd_avx(auVar13._0_16_);
    (local_8->DrawListSharedData).ClipRectFullscreen.x = (float)(int)local_40;
    (local_8->DrawListSharedData).ClipRectFullscreen.y = (float)(int)((ulong)local_40 >> 0x20);
    (local_8->DrawListSharedData).ClipRectFullscreen.z = (float)(int)local_38;
    (local_8->DrawListSharedData).ClipRectFullscreen.w = (float)(int)((ulong)local_38 >> 0x20);
    (local_8->DrawListSharedData).CurveTessellationTol = (local_8->Style).CurveTessellationTol;
    ImDrawListSharedData::SetCircleTessellationMaxError
              ((ImDrawListSharedData *)in_stack_ffffffffffffff70,x1);
    (local_8->DrawListSharedData).InitialFlags = 0;
    if (((local_8->Style).AntiAliasedLines & 1U) != 0) {
      (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 1;
    }
    if ((((local_8->Style).AntiAliasedLinesUseTex & 1U) != 0) &&
       ((local_8->Font->ContainerAtlas->Flags & 4U) == 0)) {
      (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 2;
    }
    if (((local_8->Style).AntiAliasedFill & 1U) != 0) {
      (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 4;
    }
    if (((local_8->IO).BackendFlags & 8U) != 0) {
      (local_8->DrawListSharedData).InitialFlags = (local_8->DrawListSharedData).InitialFlags | 8;
    }
    for (local_44 = 0; local_44 < (local_8->Viewports).Size; local_44 = local_44 + 1) {
      ppIVar4 = ImVector<ImGuiViewportP_*>::operator[]
                          ((ImVector<ImGuiViewportP_*> *)
                           CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                           in_stack_ffffffffffffff5c);
      local_50 = *ppIVar4;
      ImDrawData::Clear((ImDrawData *)0x1b7403);
    }
    if (((local_8->DragDropActive & 1U) != 0) &&
       ((local_8->DragDropPayload).SourceId == local_8->ActiveId)) {
      KeepAliveID((local_8->DragDropPayload).SourceId);
    }
    if (local_8->HoveredIdPreviousFrame == 0) {
      local_8->HoveredIdTimer = 0.0;
    }
    if ((local_8->HoveredIdPreviousFrame == 0) ||
       ((local_8->HoveredId != 0 && (local_8->ActiveId == local_8->HoveredId)))) {
      local_8->HoveredIdNotActiveTimer = 0.0;
    }
    if (local_8->HoveredId != 0) {
      local_8->HoveredIdTimer = (local_8->IO).DeltaTime + local_8->HoveredIdTimer;
    }
    if ((local_8->HoveredId != 0) && (local_8->ActiveId != local_8->HoveredId)) {
      local_8->HoveredIdNotActiveTimer = (local_8->IO).DeltaTime + local_8->HoveredIdNotActiveTimer;
    }
    local_8->HoveredIdPreviousFrame = local_8->HoveredId;
    local_8->HoveredIdPreviousFrameUsingMouseWheel = (bool)(local_8->HoveredIdUsingMouseWheel & 1);
    local_8->HoveredId = 0;
    local_8->HoveredIdAllowOverlap = false;
    local_8->HoveredIdUsingMouseWheel = false;
    local_8->HoveredIdDisabled = false;
    if (((local_8->ActiveIdIsAlive != local_8->ActiveId) &&
        (local_8->ActiveIdPreviousFrame == local_8->ActiveId)) && (local_8->ActiveId != 0)) {
      ClearActiveID();
    }
    if (local_8->ActiveId != 0) {
      local_8->ActiveIdTimer = (local_8->IO).DeltaTime + local_8->ActiveIdTimer;
    }
    local_8->LastActiveIdTimer = (local_8->IO).DeltaTime + local_8->LastActiveIdTimer;
    local_8->ActiveIdPreviousFrame = local_8->ActiveId;
    local_8->ActiveIdPreviousFrameWindow = local_8->ActiveIdWindow;
    local_8->ActiveIdPreviousFrameHasBeenEditedBefore =
         (bool)(local_8->ActiveIdHasBeenEditedBefore & 1);
    local_8->ActiveIdIsAlive = 0;
    local_8->ActiveIdHasBeenEditedThisFrame = false;
    local_8->ActiveIdPreviousFrameIsAlive = false;
    local_8->ActiveIdIsJustActivated = false;
    if ((local_8->TempInputId != 0) && (local_8->ActiveId != local_8->TempInputId)) {
      local_8->TempInputId = 0;
    }
    if (local_8->ActiveId == 0) {
      local_8->ActiveIdUsingNavDirMask = 0;
      local_8->ActiveIdUsingNavInputMask = 0;
      local_8->ActiveIdUsingKeyInputMask = 0;
    }
    local_8->DragDropAcceptIdPrev = local_8->DragDropAcceptIdCurr;
    local_8->DragDropAcceptIdCurr = 0;
    local_8->DragDropAcceptIdCurrRectSurface = 3.4028235e+38;
    local_8->DragDropWithinSource = false;
    local_8->DragDropWithinTarget = false;
    local_8->DragDropHoldJustPressedId = 0;
    IVar2 = GetMergedKeyModFlags();
    (local_8->IO).KeyMods = IVar2;
    memcpy((local_8->IO).KeysDownDurationPrev,(local_8->IO).KeysDownDuration,0x800);
    for (local_54 = 0; local_54 < 0x200; local_54 = local_54 + 1) {
      if (((local_8->IO).KeysDown[local_54] & 1U) == 0) {
        in_stack_ffffffffffffff64 = -1.0;
      }
      else if (0.0 <= (local_8->IO).KeysDownDuration[local_54]) {
        in_stack_ffffffffffffff64 =
             (local_8->IO).KeysDownDuration[local_54] + (local_8->IO).DeltaTime;
      }
      else {
        in_stack_ffffffffffffff64 = 0.0;
      }
      (local_8->IO).KeysDownDuration[local_54] = in_stack_ffffffffffffff64;
    }
    NavUpdate();
    UpdateMouseInputs();
    UpdateHoveredWindowAndCaptureFlags();
    UpdateMouseMovingWindowNewFrame();
    pIVar5 = GetTopMostPopupModal();
    if ((pIVar5 != (ImGuiWindow *)0x0) ||
       ((local_8->NavWindowingTarget != (ImGuiWindow *)0x0 &&
        (0.0 < local_8->NavWindowingHighlightAlpha)))) {
      fVar8 = ImMin<float>((local_8->IO).DeltaTime * 6.0 + local_8->DimBgRatio,1.0);
      local_8->DimBgRatio = fVar8;
    }
    else {
      fVar8 = ImMax<float>(-(local_8->IO).DeltaTime * 10.0 + local_8->DimBgRatio,0.0);
      local_8->DimBgRatio = fVar8;
    }
    local_8->MouseCursor = 0;
    local_8->WantTextInputNextFrame = -1;
    local_8->WantCaptureKeyboardNextFrame = -1;
    local_8->WantCaptureMouseNextFrame = -1;
    ImVec2::ImVec2(&local_5c,1.0,1.0);
    local_8->PlatformImePos = local_5c;
    UpdateMouseWheel();
    UpdateTabFocus();
    if ((local_8->WindowsFocusOrder).Size != (local_8->Windows).Size) {
      __assert_fail("g.WindowsFocusOrder.Size == g.Windows.Size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0xf93,"void ImGui::NewFrame()");
    }
    if (((local_8->GcCompactAll & 1U) != 0) || ((local_8->IO).ConfigMemoryCompactTimer < 0.0)) {
      fVar8 = 3.4028235e+38;
    }
    else {
      fVar8 = (float)local_8->Time - (local_8->IO).ConfigMemoryCompactTimer;
    }
    fVar17 = fVar8;
    for (local_64 = 0; local_64 != (local_8->Windows).Size; local_64 = local_64 + 1) {
      ppIVar6 = ImVector<ImGuiWindow_*>::operator[]
                          ((ImVector<ImGuiWindow_*> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
                           in_stack_ffffffffffffff5c);
      pIVar5 = *ppIVar6;
      pIVar5->WasActive = (bool)(pIVar5->Active & 1);
      pIVar5->BeginCount = 0;
      pIVar5->Active = false;
      pIVar5->WriteAccessed = false;
      if ((((pIVar5->WasActive & 1U) == 0) && ((pIVar5->MemoryCompacted & 1U) == 0)) &&
         (pIVar5->LastTimeActive < fVar8)) {
        GcCompactTransientWindowBuffers((ImGuiWindow *)0x1b7bf0);
      }
    }
    for (local_74 = 0; local_74 < (local_8->TablesLastTimeActive).Size; local_74 = local_74 + 1) {
      pfVar7 = ImVector<float>::operator[]
                         ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
                          in_stack_ffffffffffffff5c);
      if ((0.0 <= *pfVar7) &&
         (pfVar7 = ImVector<float>::operator[]
                             ((ImVector<float> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
                              in_stack_ffffffffffffff5c), *pfVar7 < fVar8)) {
        ImPool<ImGuiTable>::GetByIndex
                  ((ImPool<ImGuiTable> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
                   in_stack_ffffffffffffff5c);
        TableGcCompactTransientBuffers(in_stack_ffffffffffffff70);
      }
    }
    if ((local_8->GcCompactAll & 1U) != 0) {
      GcCompactTransientMiscBuffers();
    }
    local_8->GcCompactAll = false;
    if ((local_8->NavWindow != (ImGuiWindow *)0x0) && ((local_8->NavWindow->WasActive & 1U) == 0)) {
      FocusTopMostWindowUnderOne
                ((ImGuiWindow *)in_stack_ffffffffffffff80,
                 (ImGuiWindow *)CONCAT44(hook_type,in_stack_ffffffffffffff78));
    }
    ImVector<ImGuiWindow_*>::resize
              ((ImVector<ImGuiWindow_*> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
               in_stack_ffffffffffffff5c);
    ImVector<ImGuiPopupData>::resize
              ((ImVector<ImGuiPopupData> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
               in_stack_ffffffffffffff5c);
    ImVector<int>::resize
              ((ImVector<int> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),in_stack_ffffffffffffff5c
              );
    ImVector<int>::push_back
              ((ImVector<int> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
               (int *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
    ImVector<ImGuiGroupData>::resize
              ((ImVector<ImGuiGroupData> *)CONCAT44(in_stack_ffffffffffffff64,fVar17),
               in_stack_ffffffffffffff5c);
    ClosePopupsOverWindow((ImGuiWindow *)in_stack_ffffffffffffff80,SUB41(hook_type >> 0x18,0));
    UpdateDebugToolItemPicker();
    local_8->WithinFrameScopeWithImplicitWindow = true;
    ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff80,400.0,400.0);
    SetNextWindowSize((ImVec2 *)in_stack_ffffffffffffff70,(ImGuiCond)x1);
    Begin(in_stack_00000350,in_stack_00000348,in_stack_00000344);
    if ((local_8->CurrentWindow->IsFallbackWindow & 1U) != 1) {
      __assert_fail("g.CurrentWindow->IsFallbackWindow == true",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                    ,0xfc0,"void ImGui::NewFrame()");
    }
    CallContextHooks((ImGuiContext *)in_stack_ffffffffffffff80,hook_type);
    return;
  }
  __assert_fail("g.Font->IsLoaded()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0xf24,"void ImGui::NewFrame()");
}

Assistant:

void ImGui::NewFrame()
{
    IM_ASSERT(GImGui != NULL && "No current context. Did you call ImGui::CreateContext() and ImGui::SetCurrentContext() ?");
    ImGuiContext& g = *GImGui;
    
    // Remove pending delete hooks before frame start.
    // This deferred removal avoid issues of removal while iterating the hook vector
    for (int n = g.Hooks.Size - 1; n >= 0; n--)
        if (g.Hooks[n].Type == ImGuiContextHookType_PendingRemoval_)
            g.Hooks.erase(&g.Hooks[n]);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePre);

    // Check and assert for various common IO and Configuration mistakes
    ErrorCheckNewFrameSanityChecks();

    // Load settings on first frame, save settings when modified (after a delay)
    UpdateSettings();

    g.Time += g.IO.DeltaTime;
    g.WithinFrameScope = true;
    g.FrameCount += 1;
    g.TooltipOverrideCount = 0;
    g.WindowsActiveCount = 0;
    g.MenusIdSubmittedThisFrame.resize(0);

    // Calculate frame-rate for the user, as a purely luxurious feature
    g.FramerateSecPerFrameAccum += g.IO.DeltaTime - g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx];
    g.FramerateSecPerFrame[g.FramerateSecPerFrameIdx] = g.IO.DeltaTime;
    g.FramerateSecPerFrameIdx = (g.FramerateSecPerFrameIdx + 1) % IM_ARRAYSIZE(g.FramerateSecPerFrame);
    g.IO.Framerate = (g.FramerateSecPerFrameAccum > 0.0f) ? (1.0f / (g.FramerateSecPerFrameAccum / (float)IM_ARRAYSIZE(g.FramerateSecPerFrame))) : FLT_MAX;

    UpdateViewportsNewFrame();

    // Setup current font and draw list shared data
    g.IO.Fonts->Locked = true;
    SetCurrentFont(GetDefaultFont());
    IM_ASSERT(g.Font->IsLoaded());
    ImRect virtual_space(FLT_MAX, FLT_MAX, -FLT_MAX, -FLT_MAX);
    for (int n = 0; n < g.Viewports.Size; n++)
        virtual_space.Add(g.Viewports[n]->GetMainRect());
    g.DrawListSharedData.ClipRectFullscreen = virtual_space.ToVec4();
    g.DrawListSharedData.CurveTessellationTol = g.Style.CurveTessellationTol;
    g.DrawListSharedData.SetCircleTessellationMaxError(g.Style.CircleTessellationMaxError);
    g.DrawListSharedData.InitialFlags = ImDrawListFlags_None;
    if (g.Style.AntiAliasedLines)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLines;
    if (g.Style.AntiAliasedLinesUseTex && !(g.Font->ContainerAtlas->Flags & ImFontAtlasFlags_NoBakedLines))
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedLinesUseTex;
    if (g.Style.AntiAliasedFill)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AntiAliasedFill;
    if (g.IO.BackendFlags & ImGuiBackendFlags_RendererHasVtxOffset)
        g.DrawListSharedData.InitialFlags |= ImDrawListFlags_AllowVtxOffset;

    // Mark rendering data as invalid to prevent user who may have a handle on it to use it.
    for (int n = 0; n < g.Viewports.Size; n++)
    {
        ImGuiViewportP* viewport = g.Viewports[n];
        viewport->DrawDataP.Clear();
    }

    // Drag and drop keep the source ID alive so even if the source disappear our state is consistent
    if (g.DragDropActive && g.DragDropPayload.SourceId == g.ActiveId)
        KeepAliveID(g.DragDropPayload.SourceId);

    // Update HoveredId data
    if (!g.HoveredIdPreviousFrame)
        g.HoveredIdTimer = 0.0f;
    if (!g.HoveredIdPreviousFrame || (g.HoveredId && g.ActiveId == g.HoveredId))
        g.HoveredIdNotActiveTimer = 0.0f;
    if (g.HoveredId)
        g.HoveredIdTimer += g.IO.DeltaTime;
    if (g.HoveredId && g.ActiveId != g.HoveredId)
        g.HoveredIdNotActiveTimer += g.IO.DeltaTime;
    g.HoveredIdPreviousFrame = g.HoveredId;
    g.HoveredIdPreviousFrameUsingMouseWheel = g.HoveredIdUsingMouseWheel;
    g.HoveredId = 0;
    g.HoveredIdAllowOverlap = false;
    g.HoveredIdUsingMouseWheel = false;
    g.HoveredIdDisabled = false;

    // Update ActiveId data (clear reference to active widget if the widget isn't alive anymore)
    if (g.ActiveIdIsAlive != g.ActiveId && g.ActiveIdPreviousFrame == g.ActiveId && g.ActiveId != 0)
        ClearActiveID();
    if (g.ActiveId)
        g.ActiveIdTimer += g.IO.DeltaTime;
    g.LastActiveIdTimer += g.IO.DeltaTime;
    g.ActiveIdPreviousFrame = g.ActiveId;
    g.ActiveIdPreviousFrameWindow = g.ActiveIdWindow;
    g.ActiveIdPreviousFrameHasBeenEditedBefore = g.ActiveIdHasBeenEditedBefore;
    g.ActiveIdIsAlive = 0;
    g.ActiveIdHasBeenEditedThisFrame = false;
    g.ActiveIdPreviousFrameIsAlive = false;
    g.ActiveIdIsJustActivated = false;
    if (g.TempInputId != 0 && g.ActiveId != g.TempInputId)
        g.TempInputId = 0;
    if (g.ActiveId == 0)
    {
        g.ActiveIdUsingNavDirMask = 0x00;
        g.ActiveIdUsingNavInputMask = 0x00;
        g.ActiveIdUsingKeyInputMask = 0x00;
    }

    // Drag and drop
    g.DragDropAcceptIdPrev = g.DragDropAcceptIdCurr;
    g.DragDropAcceptIdCurr = 0;
    g.DragDropAcceptIdCurrRectSurface = FLT_MAX;
    g.DragDropWithinSource = false;
    g.DragDropWithinTarget = false;
    g.DragDropHoldJustPressedId = 0;

    // Update keyboard input state
    // Synchronize io.KeyMods with individual modifiers io.KeyXXX bools
    g.IO.KeyMods = GetMergedKeyModFlags();
    memcpy(g.IO.KeysDownDurationPrev, g.IO.KeysDownDuration, sizeof(g.IO.KeysDownDuration));
    for (int i = 0; i < IM_ARRAYSIZE(g.IO.KeysDown); i++)
        g.IO.KeysDownDuration[i] = g.IO.KeysDown[i] ? (g.IO.KeysDownDuration[i] < 0.0f ? 0.0f : g.IO.KeysDownDuration[i] + g.IO.DeltaTime) : -1.0f;

    // Update gamepad/keyboard navigation
    NavUpdate();

    // Update mouse input state
    UpdateMouseInputs();

    // Find hovered window
    // (needs to be before UpdateMouseMovingWindowNewFrame so we fill g.HoveredWindowUnderMovingWindow on the mouse release frame)
    UpdateHoveredWindowAndCaptureFlags();

    // Handle user moving window with mouse (at the beginning of the frame to avoid input lag or sheering)
    UpdateMouseMovingWindowNewFrame();

    // Background darkening/whitening
    if (GetTopMostPopupModal() != NULL || (g.NavWindowingTarget != NULL && g.NavWindowingHighlightAlpha > 0.0f))
        g.DimBgRatio = ImMin(g.DimBgRatio + g.IO.DeltaTime * 6.0f, 1.0f);
    else
        g.DimBgRatio = ImMax(g.DimBgRatio - g.IO.DeltaTime * 10.0f, 0.0f);

    g.MouseCursor = ImGuiMouseCursor_Arrow;
    g.WantCaptureMouseNextFrame = g.WantCaptureKeyboardNextFrame = g.WantTextInputNextFrame = -1;
    g.PlatformImePos = ImVec2(1.0f, 1.0f); // OS Input Method Editor showing on top-left of our window by default

    // Mouse wheel scrolling, scale
    UpdateMouseWheel();

    // Update legacy TAB focus
    UpdateTabFocus();

    // Mark all windows as not visible and compact unused memory.
    IM_ASSERT(g.WindowsFocusOrder.Size == g.Windows.Size);
    const float memory_compact_start_time = (g.GcCompactAll || g.IO.ConfigMemoryCompactTimer < 0.0f) ? FLT_MAX : (float)g.Time - g.IO.ConfigMemoryCompactTimer;
    for (int i = 0; i != g.Windows.Size; i++)
    {
        ImGuiWindow* window = g.Windows[i];
        window->WasActive = window->Active;
        window->BeginCount = 0;
        window->Active = false;
        window->WriteAccessed = false;

        // Garbage collect transient buffers of recently unused windows
        if (!window->WasActive && !window->MemoryCompacted && window->LastTimeActive < memory_compact_start_time)
            GcCompactTransientWindowBuffers(window);
    }

    // Garbage collect transient buffers of recently unused tables
    for (int i = 0; i < g.TablesLastTimeActive.Size; i++)
        if (g.TablesLastTimeActive[i] >= 0.0f && g.TablesLastTimeActive[i] < memory_compact_start_time)
            TableGcCompactTransientBuffers(g.Tables.GetByIndex(i));
    if (g.GcCompactAll)
        GcCompactTransientMiscBuffers();
    g.GcCompactAll = false;

    // Closing the focused window restore focus to the first active root window in descending z-order
    if (g.NavWindow && !g.NavWindow->WasActive)
        FocusTopMostWindowUnderOne(NULL, NULL);

    // No window should be open at the beginning of the frame.
    // But in order to allow the user to call NewFrame() multiple times without calling Render(), we are doing an explicit clear.
    g.CurrentWindowStack.resize(0);
    g.BeginPopupStack.resize(0);
    g.ItemFlagsStack.resize(0);
    g.ItemFlagsStack.push_back(ImGuiItemFlags_Default_);
    g.GroupStack.resize(0);
    ClosePopupsOverWindow(g.NavWindow, false);

    // [DEBUG] Item picker tool - start with DebugStartItemPicker() - useful to visually select an item and break into its call-stack.
    UpdateDebugToolItemPicker();

    // Create implicit/fallback window - which we will only render it if the user has added something to it.
    // We don't use "Debug" to avoid colliding with user trying to create a "Debug" window with custom flags.
    // This fallback is particularly important as it avoid ImGui:: calls from crashing.
    g.WithinFrameScopeWithImplicitWindow = true;
    SetNextWindowSize(ImVec2(400, 400), ImGuiCond_FirstUseEver);
    Begin("Debug##Default");
    IM_ASSERT(g.CurrentWindow->IsFallbackWindow == true);

    CallContextHooks(&g, ImGuiContextHookType_NewFramePost);
}